

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcMasterTable.h
# Opt level: O2

void __thiscall GrcMasterValueList::~GrcMasterValueList(GrcMasterValueList *this)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->m_valmapEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_valmapEntries)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
    }
  }
  std::
  _Rb_tree<GrcSymbolTableEntry_*,_std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>,_std::_Select1st<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>_>
  ::~_Rb_tree((_Rb_tree<GrcSymbolTableEntry_*,_std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>,_std::_Select1st<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>_>
               *)this);
  return;
}

Assistant:

~GrcMasterValueList()
	{
		//	Once the list has been processed, the assignment items might be deleted
		//	as part of the class definition, or whatever, so don't do it here.
		for (ValueMap::iterator it = m_valmapEntries.begin();
			it != m_valmapEntries.end();
			++it)
		{
			delete it->second; // GetValue();
		}
	}